

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm9_sign.c
# Opt level: O3

int SM9_sign(uint8_t *h,uint8_t *S,uint8_t *msg,int msglen,uint8_t *rand,uint8_t *usr_privkey,
            uint8_t *master_pubkey)

{
  BIGNUM *h_00;
  BIGNUM *rnd;
  G1 *P;
  G2 *Q;
  GT *rop;
  ATE_CTX *ctx;
  BIGNUM *range;
  G1 *P_00;
  undefined4 uVar1;
  uint8_t *puVar2;
  undefined4 in_R11D;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint8_t w [384];
  BN_CTX *local_1f8;
  uint8_t local_1b8 [392];
  
  auVar5._0_4_ = -(uint)(h == (uint8_t *)0x0);
  auVar5._4_4_ = -(uint)(S == (uint8_t *)0x0);
  auVar5._8_4_ = -(uint)(msg == (uint8_t *)0x0);
  auVar5._12_4_ = -(uint)(usr_privkey == (uint8_t *)0x0);
  iVar3 = movmskps(in_R11D,auVar5);
  if ((master_pubkey == (uint8_t *)0x0 || msglen < 0) || iVar3 != 0) {
    iVar3 = 0;
    h_00 = (BIGNUM *)0x0;
    rnd = (BIGNUM *)0x0;
    local_1f8 = (BN_CTX *)0x0;
    P = (G1 *)0x0;
    Q = (G2 *)0x0;
    rop = (GT *)0x0;
  }
  else {
    puVar2 = S;
    h_00 = BN_new();
    uVar1 = SUB84(puVar2,0);
    rnd = BN_new();
    local_1f8 = BN_CTX_new();
    P = G1_new();
    Q = G2_new();
    rop = GT_new();
    ctx = SM9_get_pairing_ctx();
    auVar4._0_4_ = -(uint)((int)((ulong)h_00 >> 0x20) == 0 && (int)h_00 == 0);
    auVar4._4_4_ = -(uint)((int)rnd == 0 && (int)((ulong)rnd >> 0x20) == 0);
    auVar4._8_4_ = -(uint)((int)((ulong)local_1f8 >> 0x20) == 0 && (int)local_1f8 == 0);
    auVar4._12_4_ = -(uint)((int)P == 0 && (int)((ulong)P >> 0x20) == 0);
    iVar3 = movmskps(uVar1,auVar4);
    if (((((rop == (GT *)0x0 || Q == (G2 *)0x0) || ctx == (ATE_CTX *)0x0) || iVar3 != 0) ||
        (range = PAIRING_get0_order(ctx), range == (BIGNUM *)0x0)) ||
       (P_00 = PAIRING_get0_generator1(ctx), P_00 == (G1 *)0x0)) {
LAB_0012d1bc:
      iVar3 = 0;
    }
    else {
      G2_point_uncompress(Q,master_pubkey,ctx);
      optate(rop,P_00,Q,ctx);
      do {
        if (rand == (uint8_t *)0x0) {
          do {
            iVar3 = BN_rand_range(rnd,(BIGNUM *)range);
            if (iVar3 == 0) goto LAB_0012d1bc;
            iVar3 = BN_is_zero((BIGNUM *)rnd);
          } while (iVar3 != 0);
        }
        else {
          BN_bin2bn(rand,0x20,rnd);
        }
        fp12_pow(rop,rop,(BIGNUM *)rnd,ctx);
        GT_to_bin(local_1b8,rop,ctx);
        sm9_H2((BIGNUM *)h_00,msg,msglen,local_1b8,0x180,range);
        BN_mod_sub(rnd,rnd,h_00,(BIGNUM *)range,local_1f8);
        iVar3 = BN_is_zero((BIGNUM *)rnd);
      } while (iVar3 != 0);
      G1_point_uncompress(P,usr_privkey,ctx);
      G1_mul(P,P,(BIGNUM *)rnd,ctx);
      BN_bn2binpad((BIGNUM *)h_00,h,0x20);
      G1_point_compress(S,P,ctx);
      iVar3 = 1;
    }
  }
  BN_free(h_00);
  BN_free(rnd);
  BN_CTX_free(local_1f8);
  G1_free(P);
  G2_free(Q);
  GT_free(rop);
  return iVar3;
}

Assistant:

int SM9_sign(uint8_t h[32], uint8_t S[65], 
             const uint8_t *msg, int msglen, uint8_t rand[32], 
             const uint8_t usr_privkey[65], const uint8_t master_pubkey[129])
{
    int ret = GML_ERROR;
    uint8_t w[384];
    BIGNUM *h_bn = NULL;
    BIGNUM *r = NULL;
    const BIGNUM *order = NULL;
    BN_CTX *bn_ctx = NULL;
    const G1 *P = NULL;
    G1 *da = NULL;
    G2 *Ppub = NULL;
    GT *g = NULL;
    const ATE_CTX *p_ctx = NULL;

    if (h == NULL || S == NULL || msg == NULL || msglen < 0 || usr_privkey == NULL || master_pubkey == NULL)
        goto end;

    h_bn = BN_new();
    r = BN_new();
    bn_ctx = BN_CTX_new();
    da = G1_new();
    Ppub = G2_new();
    g = GT_new();
    p_ctx = SM9_get_pairing_ctx();

    if (h_bn == NULL || r == NULL || bn_ctx == NULL || da == NULL ||
        Ppub == NULL || g == NULL || p_ctx == NULL )
        goto end;

    order = PAIRING_get0_order(p_ctx);
    if (order == NULL)
        goto end;

    /* P */
    P = PAIRING_get0_generator1(p_ctx);
    if (P == NULL)
        goto end;
    /* Ppub */
    G2_point_uncompress(Ppub, master_pubkey, p_ctx);

    /* g = e(P, Ppub) */
    optate(g, P, Ppub, p_ctx);

    do {
        if (rand == NULL) {
            /* random r */
            do {
                if (!BN_rand_range(r, order)) 
                    goto end;
            } while (BN_is_zero(r));
        }
        else
            BN_bin2bn(rand, 32, r);
        
        fp12_pow(g, g, r, p_ctx);

        /*  */
        GT_to_bin(w, g, p_ctx);

        /* H2(M||w, N) */
        sm9_H2(h_bn, msg, msglen, w, 384, order);

        /* r - h */
        BN_mod_sub(r, r, h_bn, order, bn_ctx);
    } while(BN_is_zero(r));

    /* da */
    G1_point_uncompress(da, usr_privkey, p_ctx);
    /* (r - h) * da */
    G1_mul(da, da, r, p_ctx);

    BN_bn2binpad(h_bn, h, 32);
    G1_point_compress(S, da, p_ctx);

    ret = GML_OK;
end:
    BN_free(h_bn);
    BN_free(r);
    BN_CTX_free(bn_ctx);
    G1_free(da);
    G2_free(Ppub);
    GT_free(g);
    return ret;
}